

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O0

bool __thiscall
V4L2Device::compress_jpeg(V4L2Device *this,RawImagePtr *image,string *jpeg_file_name)

{
  uint uVar1;
  int iVar2;
  char *__filename;
  int *piVar3;
  pointer pRVar4;
  element_type *this_00;
  uint row_stride;
  int quality;
  FILE *outfile;
  JSAMPROW row_pointer [1];
  jpeg_error_mgr jerr;
  jpeg_compress_struct cinfo;
  undefined4 uVar5;
  undefined2 in_stack_fffffffffffffb8c;
  DispatchAction in_stack_fffffffffffffb8e;
  Writer *in_stack_fffffffffffffb90;
  LineNumber in_stack_fffffffffffffb98;
  string *in_stack_fffffffffffffba0;
  Options *in_stack_fffffffffffffba8;
  allocator *paVar6;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  string *option;
  VerboseLevel in_stack_fffffffffffffbc0;
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [36];
  int local_3ac;
  char *local_3a8;
  Writer local_390;
  FILE *local_320;
  pointer local_318;
  undefined1 local_310 [32];
  string local_268;
  uint local_238;
  uint local_234;
  undefined4 local_230;
  undefined4 local_22c;
  uint local_114;
  bool local_1;
  
  local_268._0_8_ = jpeg_std_error(local_310);
  jpeg_CreateCompress(&local_268,0x50,0x248);
  __filename = (char *)std::__cxx11::string::c_str();
  local_320 = fopen(__filename,"wb");
  if (local_320 == (FILE *)0x0) {
    uVar5 = 0;
    el::base::Writer::Writer
              ((Writer *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               (Level)((ulong)in_stack_fffffffffffffba8 >> 0x30),(char *)in_stack_fffffffffffffba0,
               in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8e
               ,in_stack_fffffffffffffbc0);
    el::base::Writer::construct(&local_390,1,el::base::consts::kDefaultLoggerId);
    el::base::Writer::operator<<
              (in_stack_fffffffffffffb90,
               (char (*) [13])
               CONCAT26(in_stack_fffffffffffffb8e,CONCAT24(in_stack_fffffffffffffb8c,uVar5)));
    el::base::Writer::operator<<
              (in_stack_fffffffffffffb90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffb8e,CONCAT24(in_stack_fffffffffffffb8c,uVar5)));
    el::base::Writer::operator<<
              (in_stack_fffffffffffffb90,
               (char (*) [4])
               CONCAT26(in_stack_fffffffffffffb8e,CONCAT24(in_stack_fffffffffffffb8c,uVar5)));
    piVar3 = __errno_location();
    local_3a8 = strerror(*piVar3);
    el::base::Writer::operator<<
              (in_stack_fffffffffffffb90,
               (char **)CONCAT26(in_stack_fffffffffffffb8e,CONCAT24(in_stack_fffffffffffffb8c,uVar5)
                                ));
    el::base::Writer::~Writer(in_stack_fffffffffffffb90);
    local_1 = false;
  }
  else {
    option = &local_268;
    jpeg_stdio_dest(option,local_320);
    pRVar4 = std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::
             operator->((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
                         *)0x1eb52b);
    local_238 = pRVar4->width;
    pRVar4 = std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::
             operator->((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
                         *)0x1eb542);
    local_234 = pRVar4->height;
    local_230 = 3;
    local_22c = 2;
    jpeg_set_defaults(option);
    local_3ac = 0x4b;
    this_00 = std::__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1eb588);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d0,"quality",&local_3d1);
    iVar2 = cxxopts::Options::count(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::__cxx11::string::~string(local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    if (iVar2 != 0) {
      std::__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                in_stack_fffffffffffffb90);
      paVar6 = &local_3f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f8,"quality",paVar6);
      cxxopts::Options::operator[](this_00,option);
      in_stack_fffffffffffffb90 =
           (Writer *)cxxopts::OptionDetails::as<int>((OptionDetails *)in_stack_fffffffffffffb90);
      local_3ac = *(int *)&in_stack_fffffffffffffb90->_vptr_Writer;
      std::__cxx11::string::~string(local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    }
    jpeg_set_quality(&local_268,local_3ac,1);
    jpeg_start_compress(&local_268,1);
    pRVar4 = std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::
             operator->((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
                         *)0x1eb754);
    uVar1 = pRVar4->width;
    while (local_114 < local_234) {
      std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::operator->
                ((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
                 0x1eb779);
      local_318 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                             in_stack_fffffffffffffb90);
      local_318 = local_318 + local_114 * uVar1 * 3;
      jpeg_write_scanlines(&local_268,&local_318,1);
    }
    jpeg_finish_compress(&local_268);
    fclose(local_320);
    jpeg_destroy_compress(&local_268);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
    compress_jpeg(const RawImagePtr& image, const std::string& jpeg_file_name)
    {
        struct jpeg_compress_struct cinfo;
        struct jpeg_error_mgr jerr;

        JSAMPROW row_pointer[1];

        cinfo.err = jpeg_std_error(&jerr);
        jpeg_create_compress(&cinfo);

        FILE* outfile = fopen(jpeg_file_name.c_str(), "wb");
        if (outfile == nullptr) {
            LOG(ERROR) << "can't open '" << jpeg_file_name << "': " << strerror(errno);
            return false;
        }

        jpeg_stdio_dest(&cinfo, outfile);

        cinfo.image_width = image->width; /* image width and height, in pixels */
        cinfo.image_height = image->height;
        cinfo.input_components = 3; /* # of color components per pixel */
        cinfo.in_color_space = JCS_RGB; /* colorspace of input image */

        jpeg_set_defaults(&cinfo);

        int quality = kDefaultJPEGQuality;
        if (options->count("quality")) {
            quality = (*options)["quality"].as<int>();
        }

        jpeg_set_quality(&cinfo, quality, TRUE /* limit to baseline-JPEG values */);
        jpeg_start_compress(&cinfo, TRUE);

        auto row_stride = image->width * 3; /* JSAMPLEs per row in image_buffer */
        while (cinfo.next_scanline < cinfo.image_height) {
            row_pointer[0] = &(image->raw_data.get()[cinfo.next_scanline * row_stride]);
            jpeg_write_scanlines(&cinfo, row_pointer, 1);
        }

        jpeg_finish_compress(&cinfo);
        fclose(outfile);
        jpeg_destroy_compress(&cinfo);

        return true;
    }